

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_groups.c
# Opt level: O0

int map_sort_compar(void *l,void *r)

{
  temp_map_struc_s *rv;
  temp_map_struc_s *lv;
  void *r_local;
  void *l_local;
  
  if (*(ulong *)((long)l + 8) < *(ulong *)((long)r + 8)) {
    l_local._4_4_ = -1;
  }
  else if (*(ulong *)((long)r + 8) < *(ulong *)((long)l + 8)) {
    l_local._4_4_ = 1;
  }
  else if (*l < *r) {
    l_local._4_4_ = -1;
  }
  else if (*r < *l) {
    l_local._4_4_ = 1;
  }
  else {
    l_local._4_4_ = 0;
  }
  return l_local._4_4_;
}

Assistant:

static int
map_sort_compar(const void*l, const void*r)
{
    struct temp_map_struc_s *lv = (struct temp_map_struc_s *)l;
    struct temp_map_struc_s *rv = (struct temp_map_struc_s *)r;

    if (lv->group < rv->group) {
        return -1;
    }
    if (lv->group > rv->group) {
        return 1;
    }
    if (lv->section < rv->section) {
        return -1;
    }
    if (lv->section > rv->section) {
        return 1;
    }
    /* Should never get here! */
    return 0;

}